

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_minnow_byt_compatible.c
# Opt level: O2

mraa_board_t * mraa_intel_minnowboard_byt_compatible(mraa_boolean_t turbot)

{
  int iVar1;
  mraa_result_t mVar2;
  mraa_board_t *board;
  mraa_pininfo_t *__ptr;
  mraa_pininfo_t *pmVar3;
  char *pcVar4;
  uint uVar5;
  int sysfs_pin;
  int chip;
  int line;
  int pin_index_scl;
  int pin_index_sda;
  int uname_minor;
  int uname_major;
  utsname running_uname;
  
  board = (mraa_board_t *)calloc(1,0x5f0);
  if (board != (mraa_board_t *)0x0) {
    board->platform_name = "MinnowBoard MAX";
    pcVar4 = "Turbot";
    if (turbot == 0) {
      pcVar4 = "Ax";
    }
    uVar5 = (turbot != 0) + 0x1b;
    board->platform_version = pcVar4;
    board->phy_pin_count = uVar5;
    board->gpio_count = uVar5;
    board->chardev_capable = 1;
    __ptr = (mraa_pininfo_t *)calloc((ulong)uVar5,0x2f4);
    board->pins = __ptr;
    if (__ptr != (mraa_pininfo_t *)0x0) {
      pmVar3 = (mraa_pininfo_t *)calloc(1,0x288);
      board->adv_func = (mraa_adv_func_t *)pmVar3;
      if (pmVar3 != (mraa_pininfo_t *)0x0) {
        iVar1 = uname((utsname *)&running_uname);
        if (iVar1 == 0) {
          __isoc99_sscanf(running_uname.release,"%d.%d",&uname_major);
          if ((uname_major < 4) && (uname_minor < 0x12)) {
            arch_nr_gpios_adjust = 0;
          }
          mraa_intel_minnowboard_set_pininfo(board,0,"INVALID",(mraa_pincapabilities_t)0x0,-1,-1,-1)
          ;
          mraa_intel_minnowboard_set_pininfo(board,1,"GND",(mraa_pincapabilities_t)0x0,-1,-1,-1);
          mraa_intel_minnowboard_set_pininfo(board,2,"GND",(mraa_pincapabilities_t)0x0,-1,-1,-1);
          mraa_intel_minnowboard_set_pininfo(board,3,"5v",(mraa_pincapabilities_t)0x0,-1,-1,-1);
          mraa_intel_minnowboard_set_pininfo(board,4,"3.3v",(mraa_pincapabilities_t)0x0,-1,-1,-1);
          mraa_intel_minnowboard_set_pininfo
                    (board,5,"SPI_CS",(mraa_pincapabilities_t)0x11,0xdc,0,0x42);
          mraa_intel_minnowboard_set_pininfo
                    (board,6,"UART1TX",(mraa_pincapabilities_t)0x81,0xe1,0,0x47);
          mraa_intel_minnowboard_set_pininfo
                    (board,7,"SPIMISO",(mraa_pincapabilities_t)0x11,0xdd,0,0x43);
          mraa_intel_minnowboard_set_pininfo
                    (board,8,"UART1RX",(mraa_pincapabilities_t)0x81,0xe0,0,0x46);
          mraa_intel_minnowboard_set_pininfo
                    (board,9,"SPIMOSI",(mraa_pincapabilities_t)0x11,0xde,0,0x44);
          mraa_intel_minnowboard_set_pininfo
                    (board,10,"UART1CT",(mraa_pincapabilities_t)0x3,0xe3,0,0x49);
          mraa_intel_minnowboard_set_pininfo
                    (board,0xb,"SPI_CLK",(mraa_pincapabilities_t)0x11,0xdf,0,0x45);
          mraa_intel_minnowboard_set_pininfo
                    (board,0xc,"UART1RT",(mraa_pincapabilities_t)0x3,0xe2,0,0x48);
          mraa_intel_minnowboard_set_pininfo
                    (board,0xd,"I2C_SCL",(mraa_pincapabilities_t)0x21,0xf3,0,0x59);
          mraa_intel_minnowboard_set_pininfo
                    (board,0xe,"I2S_CLK",(mraa_pincapabilities_t)0x3,0xd8,0,0x3e);
          mraa_intel_minnowboard_set_pininfo
                    (board,0xf,"I2C_SDA",(mraa_pincapabilities_t)0x21,0xf2,0,0x58);
          mraa_intel_minnowboard_set_pininfo
                    (board,0x10,"I2S_FRM",(mraa_pincapabilities_t)0x3,0xd9,0,0x3f);
          mraa_intel_minnowboard_set_pininfo
                    (board,0x11,"UART2TX",(mraa_pincapabilities_t)0x81,0xe5,0,0x4b);
          mraa_intel_minnowboard_set_pininfo
                    (board,0x12,"I2S_DO",(mraa_pincapabilities_t)0x3,0xdb,0,0x41);
          mraa_intel_minnowboard_set_pininfo
                    (board,0x13,"UART2RX",(mraa_pincapabilities_t)0x81,0xe4,0,0x4a);
          mraa_intel_minnowboard_set_pininfo
                    (board,0x14,"I2S_DI",(mraa_pincapabilities_t)0x3,0xda,0,0x40);
          mraa_intel_minnowboard_set_pininfo(board,0x15,"S5_0",(mraa_pincapabilities_t)0x3,0x52,2,0)
          ;
          mraa_intel_minnowboard_set_pininfo
                    (board,0x16,"PWM0",(mraa_pincapabilities_t)0x5,0xf8,0,0x5e);
          mraa_intel_minnowboard_set_pininfo(board,0x17,"S5_1",(mraa_pincapabilities_t)0x3,0x53,2,1)
          ;
          mraa_intel_minnowboard_set_pininfo
                    (board,0x18,"PWM1",(mraa_pincapabilities_t)0x5,0xf9,0,0x5f);
          mraa_intel_minnowboard_set_pininfo(board,0x19,"S5_4",(mraa_pincapabilities_t)0x3,0x54,2,2)
          ;
          if (turbot == 0) {
            line = 0x36;
            pcVar4 = "IBL8254";
            iVar1 = 0x1a;
            sysfs_pin = 0xd0;
            chip = 0;
          }
          else {
            mraa_intel_minnowboard_set_pininfo
                      (board,0x1a,"I2S_MCLK",(mraa_pincapabilities_t)0x3,0xfd,0,99);
            line = 0x16;
            pcVar4 = "D2_LED";
            iVar1 = 0x1b;
            sysfs_pin = 0x68;
            chip = 2;
          }
          mraa_intel_minnowboard_set_pininfo
                    (board,iVar1,pcVar4,(mraa_pincapabilities_t)0x3,sysfs_pin,chip,line);
          board->i2c_bus_count = 1;
          mVar2 = mraa_intel_minnowboard_get_pin_index(board,"I2C_SDA",&pin_index_sda);
          if ((mVar2 == MRAA_SUCCESS) &&
             (mVar2 = mraa_intel_minnowboard_get_pin_index(board,"I2C_SCL",&pin_index_scl),
             mVar2 == MRAA_SUCCESS)) {
            uVar5 = mraa_find_i2c_bus("designware",0);
            if (uVar5 == 0xffffffff) {
              board->i2c_bus_count = 0;
            }
            else {
              board->def_i2c_bus = uVar5;
              board->i2c_bus[0].bus_id = uVar5;
              board->i2c_bus[0].sda = pin_index_sda;
              board->i2c_bus[0].scl = pin_index_scl;
            }
          }
          board->pwm_default_period = 500;
          board->pwm_max_period = 1000000000;
          board->pwm_min_period = 1;
          board->spi_bus_count = 1;
          board->def_spi_bus = 0;
          board->spi_bus[0].bus_id = 0;
          board->spi_bus[0].slave_s = 0;
          board->spi_bus[0].sclk = 0xb;
          board->spi_bus[0].mosi = 9;
          board->spi_bus[0].miso = 7;
          board->spi_bus[0].cs = 5;
          board->uart_dev_count = 1;
          board->def_uart_dev = 0;
          board->uart_dev[0].rx = -1;
          board->uart_dev[0].tx = -1;
          board->uart_dev[0].device_path = "/dev/ttyS0";
          return board;
        }
        free(__ptr);
        __ptr = pmVar3;
      }
      free(__ptr);
    }
    syslog(2,"minnowmax: Platform failed to initialise");
    free(board);
  }
  return (mraa_board_t *)0x0;
}

Assistant:

mraa_board_t*
mraa_intel_minnowboard_byt_compatible(mraa_boolean_t turbot)
{
    mraa_board_t* b = (mraa_board_t*) calloc(1, sizeof(mraa_board_t));

    struct utsname running_uname;
    int uname_major, uname_minor;

    if (b == NULL) {
        return NULL;
    }

    b->platform_name = PLATFORM_NAME;
    if (turbot) {
        b->platform_version = "Turbot";
        b->gpio_count = b->phy_pin_count = MRAA_INTEL_MINNOW_TURBOT_PINCOUNT;
    } else {
        b->platform_version = "Ax";
        b->gpio_count = b->phy_pin_count = MRAA_INTEL_MINNOW_MAX_PINCOUNT;
    }
    b->chardev_capable = 1;

    b->pins = (mraa_pininfo_t*) calloc((size_t) b->phy_pin_count, sizeof(mraa_pininfo_t));
    if (b->pins == NULL) {
        goto error;
    }

    b->adv_func = (mraa_adv_func_t*) calloc(1, sizeof(mraa_adv_func_t));
    if (b->adv_func == NULL) {
        free(b->pins);
        goto error;
    }

    if (uname(&running_uname) != 0) {
        free(b->pins);
        free(b->adv_func);
        goto error;
    }

    sscanf(running_uname.release, "%d.%d", &uname_major, &uname_minor);

    /* if we are on Linux 3.17 or lower they use a 256 max and number the GPIOs down
     * if we are on 3.18 or higher (ea584595fc85e65796335033dfca25ed655cd0ed)  (for now)
     * they start at 512 and number down, at some point this is going to change again when
     * GPIO moves to a radix.
     */
    if (uname_major <= 3 && uname_minor <= 17) {
        arch_nr_gpios_adjust = 0;
    }

    mraa_intel_minnowboard_set_pininfo(b, 0, "INVALID", (mraa_pincapabilities_t){ 0, 0, 0, 0, 0, 0, 0, 0 }, -1, -1, -1);
    mraa_intel_minnowboard_set_pininfo(b, 1, "GND", (mraa_pincapabilities_t){ 0, 0, 0, 0, 0, 0, 0, 0 }, -1, -1, -1);
    mraa_intel_minnowboard_set_pininfo(b, 2, "GND", (mraa_pincapabilities_t){ 0, 0, 0, 0, 0, 0, 0, 0 }, -1, -1, -1);
    mraa_intel_minnowboard_set_pininfo(b, 3, "5v", (mraa_pincapabilities_t){ 0, 0, 0, 0, 0, 0, 0, 0 }, -1, -1, -1);
    mraa_intel_minnowboard_set_pininfo(b, 4, "3.3v", (mraa_pincapabilities_t){ 0, 0, 0, 0, 0, 0, 0, 0 }, -1, -1, -1);
    mraa_intel_minnowboard_set_pininfo(b, 5, "SPI_CS", (mraa_pincapabilities_t){ 1, 0, 0, 0, 1, 0, 0, 0 }, 220, 0, 66);
    mraa_intel_minnowboard_set_pininfo(b, 6, "UART1TX", (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 1 }, 225, 0, 71);
    mraa_intel_minnowboard_set_pininfo(b, 7, "SPIMISO", (mraa_pincapabilities_t){ 1, 0, 0, 0, 1, 0, 0, 0 }, 221, 0, 67);
    mraa_intel_minnowboard_set_pininfo(b, 8, "UART1RX", (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 1 }, 224, 0, 70);
    mraa_intel_minnowboard_set_pininfo(b, 9, "SPIMOSI", (mraa_pincapabilities_t){ 1, 0, 0, 0, 1, 0, 0, 0 }, 222, 0, 68);
    mraa_intel_minnowboard_set_pininfo(b, 10, "UART1CT", (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, 227, 0, 73);
    mraa_intel_minnowboard_set_pininfo(b, 11, "SPI_CLK", (mraa_pincapabilities_t){ 1, 0, 0, 0, 1, 0, 0, 0 }, 223, 0, 69);
    mraa_intel_minnowboard_set_pininfo(b, 12, "UART1RT", (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, 226, 0, 72);
    mraa_intel_minnowboard_set_pininfo(b, 13, "I2C_SCL", (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 1, 0, 0 }, 243, 0, 89);
    mraa_intel_minnowboard_set_pininfo(b, 14, "I2S_CLK", (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, 216, 0, 62);
    mraa_intel_minnowboard_set_pininfo(b, 15, "I2C_SDA", (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 1, 0, 0 }, 242, 0, 88);
    mraa_intel_minnowboard_set_pininfo(b, 16, "I2S_FRM", (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, 217, 0, 63);
    mraa_intel_minnowboard_set_pininfo(b, 17, "UART2TX", (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 1 }, 229, 0, 75);
    mraa_intel_minnowboard_set_pininfo(b, 18, "I2S_DO", (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, 219, 0, 65);
    mraa_intel_minnowboard_set_pininfo(b, 19, "UART2RX", (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 1 }, 228, 0, 74);
    mraa_intel_minnowboard_set_pininfo(b, 20, "I2S_DI", (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, 218, 0, 64);
    mraa_intel_minnowboard_set_pininfo(b, 21, "S5_0", (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, 82, 2, 0);
    mraa_intel_minnowboard_set_pininfo(b, 22, "PWM0", (mraa_pincapabilities_t){ 1, 0, 1, 0, 0, 0, 0, 0 },
                     248, 0, 94); // Assume BIOS configured for PWM
    mraa_intel_minnowboard_set_pininfo(b, 23, "S5_1", (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, 83, 2, 1);
    mraa_intel_minnowboard_set_pininfo(b, 24, "PWM1", (mraa_pincapabilities_t){ 1, 0, 1, 0, 0, 0, 0, 0 },
                     249, 0, 95); // Assume BIOS configured for PWM
    mraa_intel_minnowboard_set_pininfo(b, 25, "S5_4", (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, 84, 2, 2);
    if (turbot) {
        mraa_intel_minnowboard_set_pininfo(b, 26, "I2S_MCLK", (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, 253, 0, 99);
        mraa_intel_minnowboard_set_pininfo(b, 27, "D2_LED", (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, 104, 2, 22);
    } else {
        mraa_intel_minnowboard_set_pininfo(b, 26, "IBL8254", (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, 208, 0, 54);
    }

    // Set number of i2c adaptors usable from userspace
    b->i2c_bus_count = 1;

    // Configure i2c adaptor #7 and make it the default
    int pin_index_sda, pin_index_scl;
    if (mraa_intel_minnowboard_get_pin_index(b, "I2C_SDA", &pin_index_sda) == MRAA_SUCCESS &&
        mraa_intel_minnowboard_get_pin_index(b, "I2C_SCL", &pin_index_scl) == MRAA_SUCCESS) {
        int bus = mraa_find_i2c_bus(I2CNAME, 0);
        if (bus == -1) {
            b->i2c_bus_count = 0;
        } else {
            b->def_i2c_bus = (unsigned int) bus;
            b->i2c_bus[0].bus_id = b->def_i2c_bus;
            b->i2c_bus[0].sda = pin_index_sda;
            b->i2c_bus[0].scl = pin_index_scl;
        }
    }

    // Configure PWM
    b->pwm_default_period = 500;
    b->pwm_max_period = 1000000000;
    b->pwm_min_period = 1;

    b->spi_bus_count = 1;
    b->def_spi_bus = 0;
    b->spi_bus[0].bus_id = 0;
    b->spi_bus[0].slave_s = 0;
    b->spi_bus[0].cs = 5;
    b->spi_bus[0].mosi = 9;
    b->spi_bus[0].miso = 7;
    b->spi_bus[0].sclk = 11;

    b->uart_dev_count = 1;
    b->def_uart_dev = 0;
    b->uart_dev[0].rx = -1;
    b->uart_dev[0].tx = -1;
    b->uart_dev[0].device_path = "/dev/ttyS0";

    return b;
error:
    syslog(LOG_CRIT, "minnowmax: Platform failed to initialise");
    free(b);
    return NULL;
}